

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

void __thiscall
booster::locale::basic_message<char>::basic_message
          (basic_message<char> *this,string_type *context,string_type *id)

{
  this->n_ = 0;
  this->c_id_ = (char_type *)0x0;
  this->c_context_ = (char_type *)0x0;
  this->c_plural_ = (char_type *)0x0;
  std::__cxx11::string::string((string *)&this->id_,(string *)id);
  std::__cxx11::string::string((string *)&this->context_,(string *)context);
  (this->plural_)._M_dataplus._M_p = (pointer)&(this->plural_).field_2;
  (this->plural_)._M_string_length = 0;
  (this->plural_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit basic_message(string_type const &context,string_type const &id) :
                n_(0),
                c_id_(0),
                c_context_(0),
                c_plural_(0),
                id_(id),
                context_(context)
            {
            }